

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

bool saves_spell(int level,CHAR_DATA *victim,int dam_type)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  AFFECT_DATA *pAVar6;
  float fVar7;
  float local_1c;
  
  if ((victim->fighting == (CHAR_DATA *)0x0) || (iVar4 = get_trust(victim->fighting), iVar4 != 0x3c)
     ) {
    sVar1 = victim->saving_throw;
    if (sVar1 < 0) {
      iVar4 = (victim->level - level) * 4 + 0x28;
      local_1c = SQRT((float)-(int)sVar1) * 4.0;
    }
    else {
      iVar4 = (victim->level - level) * 4 + 0x2d;
      local_1c = SQRT((float)(int)sVar1) * -4.0;
    }
    local_1c = local_1c + (float)iVar4;
    bVar2 = is_npc(victim);
    if (bVar2) {
      local_1c = local_1c + (float)(int)(victim->level / 3);
    }
    iVar4 = check_immune(victim,dam_type);
    bVar2 = true;
    if (iVar4 != 1) {
      if (iVar4 == 3) {
        local_1c = local_1c * 0.7;
      }
      else if (iVar4 == 2) {
        bVar3 = is_npc(victim);
        if ((bVar3) || (bVar3 = str_cmp(pc_race_table[victim->race].name,"imp"), bVar3)) {
          local_1c = local_1c * 1.3;
        }
        else {
          local_1c = local_1c * 1.1;
        }
      }
      iVar4 = skill_lookup("strength of faith");
      bVar3 = is_affected(victim,iVar4);
      if ((!bVar3) || (iVar4 = number_percent(), dam_type != 10 && 0x31 < iVar4)) {
        bVar2 = is_affected(victim,(int)gsn_traitors_luck);
        if (bVar2) {
          pAVar6 = affect_find(victim->affected,(int)gsn_traitors_luck);
          if ((victim->fighting != (CHAR_DATA *)0x0) && (victim->fighting == pAVar6->owner)) {
            local_1c = local_1c + -50.0;
          }
        }
        bVar2 = is_affected_room(victim->in_room,(int)gsn_infidels_fate);
        if ((bVar2) && (bVar2 = is_good(victim), bVar2)) {
          local_1c = local_1c + -20.0;
        }
        if (5.0 <= local_1c) {
          fVar7 = 95.0;
          if (local_1c <= 95.0) {
            fVar7 = local_1c;
          }
          iVar4 = (int)fVar7;
        }
        else {
          iVar4 = 5;
        }
        iVar5 = number_percent();
        bVar2 = iVar5 < iVar4;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool saves_spell(int level, CHAR_DATA *victim, int dam_type)
{
	int roll;
	float save;
	AFFECT_DATA *af;
	//    char buf[MSL];
	if (victim->fighting && get_trust(victim->fighting) == MAX_LEVEL)
		return false;

	if (victim->saving_throw < 0)
		save = 40 + (victim->level - level) * 4 + (sqrt(abs(victim->saving_throw))) * 4;
	else
		save = 45 + (victim->level - level) * 4 - (sqrt(victim->saving_throw)) * 4;

	if (is_npc(victim))
		save += victim->level / 3; /* simulate npc saving throw */

	switch (check_immune(victim, dam_type))
	{
		case IS_IMMUNE:
			return true;
		case IS_RESISTANT:
			if (!is_npc(victim) && !str_cmp(pc_race_table[victim->race].name, "imp"))
				save *= 1.1;
			else
				save *= 1.3;

			break;
		case IS_VULNERABLE:
			save *= .7;
			break;
	}

	if (is_affected(victim, skill_lookup("strength of faith")) && (number_percent() < 50 || dam_type == DAM_HOLY))
		return true;

	/*
	if (!is_npc(victim) && victim->Class()->fMana)
		save = 9 * save / 10;
	*/

	if (is_affected(victim, gsn_traitors_luck))
	{
		af = affect_find(victim->affected, gsn_traitors_luck);
		if (victim->fighting && (victim->fighting == af->owner))
			save -= 50;
	}

	if (is_affected_room(victim->in_room, gsn_infidels_fate) && is_good(victim))
		save -= 20;

	save = URANGE(5, save, 95);
	roll = number_percent();

	/*
	if(victim->fighting && !is_npc(victim->fighting) && !is_npc(victim))
	{
		sprintf(buf,"Saves_spell: Caster is probably %s, victim is %s, dt is %d.  Victim level %d, spell level %d (%d - %.2f%%mod)."\
			" Victim has %dsvs (%.2f%%mod).  Chance of saving is %d, roll is %d: %s",
			victim->fighting->name,
			victim->true_name,
			dam_type,
			victim->level,
			level,
			victim->level - level,
			(float)((victim->level - level) * 4),
			victim->saving_throw,
			(float)sqrt(abs(victim->saving_throw)) * 4,
			save,
			roll,
			roll < save ? "SAVED" : "FAILED");
		wiznet(buf,0,nullptr,WIZ_DEBUG,0,0);
	}
	else if(!is_npc(victim))
	{
		sprintf(buf,"Saves_spell: victim is %s.  Victim level %d, spell level %d (%d - %.2f%%mod).",
			victim->name,
			victim->level,
			level,
			victim->level - level,
			(float)((victim->level - level) * 4));
		wiznet(buf,0,nullptr,WIZ_DEBUG,0,0);
	}
	*/

	return (roll < (int)save);
}